

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O3

bool __thiscall webrtc::AudioEncoderIsacT<webrtc::IsacFloat>::Config::IsOk(Config *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->max_bit_rate;
  if (((31999 < iVar1 || iVar1 == -1) &&
      (iVar2 = this->max_payload_size_bytes, 0x77 < iVar2 || iVar2 == -1)) &&
     ((this->adaptive_mode != true || ((this->bwinfo).ptr_ != (LockedIsacBandwidthInfo *)0x0)))) {
    if (this->sample_rate_hz == 32000) {
      if (((iVar1 < 0x27101) && (iVar2 < 0x259)) && (this->frame_size_ms == 0x1e)) {
        if (this->bit_rate != 0) {
          return this->bit_rate - 10000U < 0xb3b1;
        }
        return true;
      }
    }
    else if (((this->sample_rate_hz == 16000) && (iVar2 < 0x191 && iVar1 < 0xd099)) &&
            ((this->frame_size_ms == 0x3c || (this->frame_size_ms == 0x1e)))) {
      if (this->bit_rate != 0) {
        return this->bit_rate - 10000U < 0x55f1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool AudioEncoderIsacT<T>::Config::IsOk() const {
  if (max_bit_rate < 32000 && max_bit_rate != -1)
    return false;
  if (max_payload_size_bytes < 120 && max_payload_size_bytes != -1)
    return false;
  if (adaptive_mode && !bwinfo)
    return false;
  switch (sample_rate_hz) {
    case 16000:
      if (max_bit_rate > 53400)
        return false;
      if (max_payload_size_bytes > 400)
        return false;
      return (frame_size_ms == 30 || frame_size_ms == 60) &&
             (bit_rate == 0 || (bit_rate >= 10000 && bit_rate <= 32000));
    case 32000:
      if (max_bit_rate > 160000)
        return false;
      if (max_payload_size_bytes > 600)
        return false;
      return T::has_swb &&
             (frame_size_ms == 30 &&
              (bit_rate == 0 || (bit_rate >= 10000 && bit_rate <= 56000)));
    default:
      return false;
  }
}